

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O0

int actorpp::detail::
    readable_channel<std::vector<unsigned_char,std::allocator<unsigned_char>>,actorpp::CloseReason>
              (int i,Channel<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *c,
              Channel<actorpp::CloseReason> *chans)

{
  bool bVar1;
  Channel<actorpp::CloseReason> *chans_local;
  Channel<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *c_local;
  int i_local;
  
  bVar1 = Channel<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::readable_with_lock
                    (c);
  c_local._4_4_ = i;
  if (!bVar1) {
    c_local._4_4_ = readable_channel<actorpp::CloseReason>(i + 1,chans);
  }
  return c_local._4_4_;
}

Assistant:

int readable_channel(int i, Channel<T> &c, Channel<Ttail> &...chans) {
  if (c.readable_with_lock())
    return i;
  else
    return readable_channel(i + 1, chans...);
}